

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerGetCachedFunc(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  uint32 uVar2;
  Opnd *pOVar3;
  IntConstOpnd *this_00;
  RegOpnd *baseOpnd;
  long lVar4;
  IndirOpnd *newSrc;
  Instr *instrPrev;
  RegOpnd *src1Opnd;
  IntConstOpnd *src2Opnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::UnlinkSrc2(instr);
  this_00 = IR::Opnd::AsIntConstOpnd(pOVar3);
  pOVar3 = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar3);
  pIVar1 = instr->m_prev;
  lVar4 = IR::EncodableOpnd<long>::GetValue(&this_00->super_EncodableOpnd<long>);
  uVar2 = Js::ActivationObjectEx::GetOffsetOfCache();
  newSrc = IR::IndirOpnd::New(baseOpnd,(int)(lVar4 << 4) + uVar2,TyVar,this->m_func,false);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  LowererMD::ChangeToAssign(instr);
  IR::Opnd::Free(&this_00->super_Opnd,this->m_func);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerGetCachedFunc(IR::Instr *instr)
{
    // src1 is an ActivationObjectEx, and we want to get the function object identified by the index (src2)
    // dst = MOV (src1)->GetFuncCacheEntry(src2)->func
    //
    // => [src1 + (offsetof(src1, cache) + (src2 * sizeof(FuncCacheEntry)) + offsetof(FuncCacheEntry, func))]

    IR::IntConstOpnd *src2Opnd = instr->UnlinkSrc2()->AsIntConstOpnd();
    IR::RegOpnd *src1Opnd = instr->UnlinkSrc1()->AsRegOpnd();
    IR::Instr *instrPrev = instr->m_prev;

    instr->SetSrc1(IR::IndirOpnd::New(src1Opnd, int32((src2Opnd->GetValue() * sizeof(Js::FuncCacheEntry)) + Js::ActivationObjectEx::GetOffsetOfCache() + offsetof(Js::FuncCacheEntry, func)), TyVar, this->m_func));

    this->m_lowererMD.ChangeToAssign(instr);

    src2Opnd->Free(this->m_func);

    return instrPrev;
}